

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogramovserver.cpp
# Opt level: O3

void __thiscall HistogramOvserver::onNotified(HistogramOvserver *this)

{
  int index;
  DataTable *this_00;
  int data;
  int local_1c;
  
  this_00 = (this->super_DataTableObserver)._table;
  if (0 < (int)((ulong)((long)(this_00->_table).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this_00->_table).super__Vector_base<int,_std::allocator<int>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 2)) {
    index = 0;
    do {
      DataTable::get(this_00,index,&local_1c);
      printData((HistogramOvserver *)this_00,local_1c,index);
      index = index + 1;
      this_00 = (this->super_DataTableObserver)._table;
    } while (index < (int)((ulong)((long)(this_00->_table).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_finish -
                                  (long)(this_00->_table).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start) >> 2));
  }
  return;
}

Assistant:

void HistogramOvserver::onNotified()
{
	for (int i = 0; i < _table->count(); ++i) {
		int data;
		_table->get(i, &data);
		printData(data, i);
	}
}